

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O3

void CompiledMixedType<unsigned_long,short>(void)

{
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> SVar1;
  uint64_t tmp_4;
  bool bVar2;
  uint64_t tmp;
  uint64_t t1;
  SafeInt<unsigned_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_38;
  uint64_t local_30;
  short local_22;
  
  local_30 = 0;
  local_38.m_int = 0;
  LargeIntRegMultiply<unsigned_long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_30,0,&local_38.m_int);
  local_30 = 0;
  local_38.m_int = 0;
  LargeIntRegMultiply<unsigned_long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_30,0,&local_38.m_int);
  local_30 = 0;
  local_38.m_int = 0;
  LargeIntRegMultiply<unsigned_long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_30,0,&local_38.m_int);
  local_30 = local_38.m_int;
  local_38.m_int = 0;
  LargeIntRegMultiply<unsigned_long,_int>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_30,0,&local_38.m_int);
  local_38.m_int = 1;
  local_22 = 1;
  local_30 = 0;
  DivisionHelper<unsigned_long,_short,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,&local_22,&local_30);
  operator/(1,local_38);
  local_30._0_2_ = 1;
  DivisionHelper<unsigned_long,_short,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(short *)&local_30,&local_38.m_int);
  local_30 = CONCAT62(local_30._2_6_,1);
  DivisionHelper<unsigned_long,_short,_1>::
  DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            (&local_38.m_int,(short *)&local_30,&local_38.m_int);
  if ((local_38.m_int != 0xffffffffffffffff) &&
     (bVar2 = local_38.m_int != 0xfffffffffffffffe, local_38.m_int = local_38.m_int + 1, bVar2)) {
    local_38.m_int = 0;
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,1);
    SVar1 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<
                      ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_38,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator<<(SVar1.m_int,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
              );
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,1);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator<<=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,1);
    SVar1 = SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>
                      ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>
                        *)&local_38,
                       (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    operator>>(SVar1.m_int,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1
              );
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,1);
    SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
              ((SafeInt<unsigned_long,safeint_exception_handlers::SafeInt_InvalidParameter> *)
               &local_38,(SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter>)0x1);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}